

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

int bddVarToCanonical(DdManager *dd,DdNode **fp,DdNode **gp,DdNode **hp,uint *topfp,uint *topgp,
                     uint *tophp)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  uint uVar4;
  bool bVar5;
  uint *puVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  bool bVar9;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_8c;
  int change;
  int comple;
  DdNode *one;
  uint toph;
  uint topg;
  uint topf;
  DdNode *h;
  DdNode *g;
  DdNode *f;
  DdNode *r;
  DdNode *H;
  DdNode *G;
  DdNode *F;
  uint *topgp_local;
  uint *topfp_local;
  DdNode **hp_local;
  DdNode **gp_local;
  DdNode **fp_local;
  DdManager *dd_local;
  
  pDVar1 = dd->one;
  _topg = *fp;
  pDVar2 = *gp;
  pDVar3 = *hp;
  puVar6 = (uint *)((ulong)_topg & 0xfffffffffffffffe);
  pDVar7 = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
  pDVar8 = (DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe);
  if (*puVar6 == 0x7fffffff) {
    local_94 = *puVar6;
  }
  else {
    local_94 = dd->perm[*puVar6];
  }
  if (pDVar7->index == 0x7fffffff) {
    local_98 = pDVar7->index;
  }
  else {
    local_98 = dd->perm[pDVar7->index];
  }
  if (pDVar8->index == 0x7fffffff) {
    local_9c = pDVar8->index;
  }
  else {
    local_9c = dd->perm[pDVar8->index];
  }
  bVar5 = false;
  uVar4 = (uint)_topg;
  h = pDVar2;
  g = _topg;
  if (pDVar7 == pDVar1) {
    if ((local_9c < local_94) ||
       ((local_94 == local_9c &&
        ((*(long *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 0x20) << 1 |
         (long)(int)((uint)pDVar3 & 1)) <
         (*(long *)(((ulong)_topg & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)(uVar4 & 1)))))) {
      g = pDVar3;
      if (pDVar2 != pDVar1) {
        g = (DdNode *)((ulong)pDVar3 ^ 1);
        _topg = (DdNode *)((ulong)_topg ^ 1);
      }
      bVar5 = true;
      pDVar3 = _topg;
    }
  }
  else if (pDVar8 == pDVar1) {
    if ((local_98 < local_94) ||
       ((local_94 == local_98 &&
        ((*(long *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 0x20) << 1 |
         (long)(int)((uint)pDVar2 & 1)) <
         (*(long *)(((ulong)_topg & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)(uVar4 & 1)))))) {
      h = _topg;
      g = pDVar2;
      if (pDVar3 == pDVar1) {
        g = (DdNode *)((ulong)pDVar2 ^ 1);
        h = (DdNode *)((ulong)_topg ^ 1);
      }
      bVar5 = true;
    }
  }
  else {
    g = _topg;
    if ((pDVar2 == (DdNode *)((ulong)pDVar3 ^ 1)) &&
       ((local_98 < local_94 ||
        ((g = _topg, local_94 == local_98 &&
         (g = _topg,
         (*(long *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 0x20) << 1 |
         (long)(int)((uint)pDVar2 & 1)) <
         (*(long *)(((ulong)_topg & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)(uVar4 & 1))))))))
    {
      bVar5 = true;
      pDVar3 = (DdNode *)((ulong)_topg ^ 1);
      h = _topg;
      g = pDVar2;
    }
  }
  _topg = pDVar3;
  pDVar1 = h;
  if (((ulong)g & 1) != 0) {
    g = (DdNode *)((ulong)g ^ 1);
    h = _topg;
    _topg = pDVar1;
    bVar5 = true;
  }
  bVar9 = ((ulong)h & 1) != 0;
  if (bVar9) {
    h = (DdNode *)((ulong)h ^ 1);
    _topg = (DdNode *)((ulong)_topg ^ 1);
    bVar5 = true;
  }
  local_8c = (uint)bVar9;
  if (bVar5) {
    *fp = g;
    *gp = h;
    *hp = _topg;
  }
  if (g->index == 0x7fffffff) {
    local_a0 = g->index;
  }
  else {
    local_a0 = dd->perm[g->index];
  }
  *topfp = local_a0;
  if (h->index == 0x7fffffff) {
    local_a4 = h->index;
  }
  else {
    local_a4 = dd->perm[h->index];
  }
  *topgp = local_a4;
  if (*(int *)((ulong)_topg & 0xfffffffffffffffe) == 0x7fffffff) {
    local_a8 = *(uint *)((ulong)_topg & 0xfffffffffffffffe);
  }
  else {
    local_a8 = dd->perm[*(uint *)((ulong)_topg & 0xfffffffffffffffe)];
  }
  *tophp = local_a8;
  return local_8c;
}

Assistant:

static int
bddVarToCanonical(
  DdManager * dd,
  DdNode ** fp,
  DdNode ** gp,
  DdNode ** hp,
  unsigned int * topfp,
  unsigned int * topgp,
  unsigned int * tophp)
{
    register DdNode             *F, *G, *H, *r, *f, *g, *h;
    register unsigned int       topf, topg, toph;
    DdNode                      *one = dd->one;
    int                         comple, change;

    f = *fp;
    g = *gp;
    h = *hp;
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    H = Cudd_Regular(h);
    topf = cuddI(dd,F->index);
    topg = cuddI(dd,G->index);
    toph = cuddI(dd,H->index);

    change = 0;

    if (G == one) {                     /* ITE(F,c,H) */
        if ((topf > toph) || (topf == toph && cuddF2L(f) > cuddF2L(h))) {
            r = h;
            h = f;
            f = r;                      /* ITE(F,1,H) = ITE(H,1,F) */
            if (g != one) {     /* g == zero */
                f = Cudd_Not(f);                /* ITE(F,0,H) = ITE(!H,0,!F) */
                h = Cudd_Not(h);
            }
            change = 1;
        }
    } else if (H == one) {              /* ITE(F,G,c) */
        if ((topf > topg) || (topf == topg && cuddF2L(f) > cuddF2L(g))) {
            r = g;
            g = f;
            f = r;                      /* ITE(F,G,0) = ITE(G,F,0) */
            if (h == one) {
                f = Cudd_Not(f);                /* ITE(F,G,1) = ITE(!G,!F,1) */
                g = Cudd_Not(g);
            }
            change = 1;
        }
    } else if (g == Cudd_Not(h)) {      /* ITE(F,G,!G) = ITE(G,F,!F) */
        if ((topf > topg) || (topf == topg && cuddF2L(f) > cuddF2L(g))) {
            r = f;
            f = g;
            g = r;
            h = Cudd_Not(r);
            change = 1;
        }
    }
    /* adjust pointers so that the first 2 arguments to ITE are regular */
    if (Cudd_IsComplement(f) != 0) {    /* ITE(!F,G,H) = ITE(F,H,G) */
        f = Cudd_Not(f);
        r = g;
        g = h;
        h = r;
        change = 1;
    }
    comple = 0;
    if (Cudd_IsComplement(g) != 0) {    /* ITE(F,!G,H) = !ITE(F,G,!H) */
        g = Cudd_Not(g);
        h = Cudd_Not(h);
        change = 1;
        comple = 1;
    }
    if (change != 0) {
        *fp = f;
        *gp = g;
        *hp = h;
    }
    *topfp = cuddI(dd,f->index);
    *topgp = cuddI(dd,g->index);
    *tophp = cuddI(dd,Cudd_Regular(h)->index);

    return(comple);

}